

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carray.hpp
# Opt level: O2

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char[8],void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,char (*v) [8])

{
  void *pvVar1;
  size_t len;
  
  pvVar1 = memchr(v,0,8);
  len = 8;
  if (pvVar1 != (void *)0x0) {
    len = (size_t)(uint)((int)pvVar1 - (int)v);
  }
  packer<msgpack::v1::sbuffer>::pack_str(o,(uint32_t)len);
  packer<msgpack::v1::sbuffer>::append_buffer(o,*v,len);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char(&v)[N]) const {
        char const* p = v;
        uint32_t size = checked_get_container_size(N);
        char const* p2 = static_cast<char const*>(std::memchr(p, '\0', size));
        uint32_t adjusted_size = p2 ? static_cast<uint32_t>(p2 - p) : size;
        o.pack_str(adjusted_size);
        o.pack_str_body(p, adjusted_size);
        return o;
    }